

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Phi(ImageInfiniteLight *this,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  RGB *pRVar3;
  ulong uVar4;
  ulong uVar5;
  int c;
  int c_00;
  Point2i p;
  undefined1 auVar6 [64];
  undefined1 extraout_var [60];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar10;
  SampledSpectrum sumL;
  RGB local_c8;
  ulong local_b8;
  Tuple2<pbrt::Point2,_int> local_b0;
  ulong local_a8;
  SampledWavelengths *local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  SampledSpectrum local_78;
  SampledSpectrum local_68;
  undefined1 local_58 [2] [16];
  undefined1 auVar9 [56];
  
  auVar6 = ZEXT1664(ZEXT816(0) << 0x40);
  local_a0 = lambda;
  SampledSpectrum::SampledSpectrum(&local_78,0.0);
  local_b0 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_b8 = (ulong)local_b0 >> 0x20;
  local_88 = (ulong)(uint)(~(local_b0.x >> 0x1f) & local_b0.x);
  local_a8 = (ulong)(uint)(~(local_b0.y >> 0x1f) & local_b0.y);
  uVar4 = 0;
  while (uVar4 != local_a8) {
    local_98 = uVar4 << 0x20;
    uVar5 = 0;
    local_90 = uVar4;
    while (uVar5 != local_88) {
      local_c8.r = 0.0;
      local_c8.g = 0.0;
      local_c8.b = 0.0;
      p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_98 | uVar5);
      local_80 = uVar5;
      for (c_00 = 0; auVar9 = auVar6._8_56_, c_00 != 3; c_00 = c_00 + 1) {
        auVar6._0_4_ = Image::GetChannel(&this->image,p,c_00,
                                         (array<pbrt::WrapMode,_2>)
                                         *(array<pbrt::WrapMode,_2> *)(this->wrapMode).wrap.values);
        auVar6._4_60_ = extraout_var;
        pRVar3 = &local_c8;
        if ((c_00 != 0) && (pRVar3 = (RGB *)&local_c8.g, c_00 != 1)) {
          pRVar3 = (RGB *)&local_c8.b;
        }
        pRVar3->r = auVar6._0_4_;
      }
      RGBSpectrum::RGBSpectrum((RGBSpectrum *)local_58,this->imageColorSpace,&local_c8);
      SVar10 = RGBSpectrum::Sample((RGBSpectrum *)local_58,local_a0);
      auVar7._0_8_ = SVar10.values.values._0_8_;
      auVar7._8_56_ = auVar9;
      auVar1._8_8_ = in_XMM1_Qb;
      auVar1._0_8_ = SVar10.values.values._8_8_;
      local_68.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar1);
      auVar6 = ZEXT1664((undefined1  [16])local_68.values.values);
      SampledSpectrum::operator+=(&local_78,&local_68);
      uVar5 = local_80 + 1;
    }
    uVar4 = local_90 + 1;
  }
  auVar9 = (undefined1  [56])0x0;
  SVar10 = SampledSpectrum::operator*
                     (&local_78,this->sceneRadius * this->sceneRadius * 39.47842 * this->scale);
  auVar8._0_8_ = SVar10.values.values._0_8_;
  auVar8._8_56_ = auVar9;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar10.values.values._8_8_;
  local_58[0] = vmovlhps_avx(auVar8._0_16_,auVar2);
  SVar10 = SampledSpectrum::operator/
                     ((SampledSpectrum *)local_58,(float)((int)local_b8 * local_b0.x));
  return (array<float,_4>)(array<float,_4>)SVar10;
}

Assistant:

SampledSpectrum ImageInfiniteLight::Phi(const SampledWavelengths &lambda) const {
    // We're really computing fluence, then converting to power, for what
    // that's worth..
    SampledSpectrum sumL(0.);

    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        for (int u = 0; u < width; ++u) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({u, v}, c, wrapMode);
            sumL += RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
        }
    }
    // Integrating over the sphere, so 4pi for that.  Then one more for Pi
    // r^2 for the area of the disk receiving illumination...
    return 4 * Pi * Pi * Sqr(sceneRadius) * scale * sumL / (width * height);
}